

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

la_int64_t archive_seek_data(archive *_a,int64_t offset,int whence)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  la_int64_t lVar2;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,4,"archive_seek_data_block");
  if (iVar1 != -0x1e) {
    UNRECOVERED_JUMPTABLE = *(code **)(_a[0xf].error_string.length + 0x38);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      lVar2 = (*UNRECOVERED_JUMPTABLE)(_a,offset,whence);
      return lVar2;
    }
    archive_set_error(_a,0x16,"Internal error: No format_seek_data_block function registered");
  }
  return -0x1e;
}

Assistant:

la_int64_t
archive_seek_data(struct archive *_a, int64_t offset, int whence)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_seek_data_block");

	if (a->format->seek_data == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Internal error: "
		    "No format_seek_data_block function registered");
		return (ARCHIVE_FATAL);
	}

	return (a->format->seek_data)(a, offset, whence);
}